

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnImportException
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index except_index,TypeVector *sig)

{
  Enum EVar1;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnImportException(import_index: %u, except_index: %u, sig: ",
                 (ulong)import_index,(ulong)except_index);
  LogTypes(this,sig);
  Stream::Writef(this->stream_,")\n");
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x14])
                    (this->reader_,(ulong)import_index,module_name.data_,module_name.size_,
                     field_name.data_,field_name.size_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportException(Index import_index,
                                              string_view module_name,
                                              string_view field_name,
                                              Index except_index,
                                              TypeVector& sig) {
  LOGF("OnImportException(import_index: %" PRIindex ", except_index: %" PRIindex
       ", sig: ",
       import_index, except_index);
  LogTypes(sig);
  LOGF_NOINDENT(")\n");
  return reader_->OnImportException(import_index, module_name, field_name,
                                    except_index, sig);
}